

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::BVHNIntersector1<4,_16781328,_true,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  uint uVar20;
  ulong uVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  RayQueryContext *extraout_RDX;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  float fVar28;
  float fVar29;
  float fVar48;
  float fVar50;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar49;
  float fVar51;
  float fVar52;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  float fVar58;
  float fVar67;
  float fVar69;
  vfloat4 a0;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 ai_3;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  float fVar83;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  undefined1 auVar81 [16];
  float fVar85;
  float fVar90;
  float fVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar92;
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar98;
  float fVar99;
  vint4 ai;
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  float fVar103;
  float fVar104;
  undefined1 auVar101 [16];
  float fVar105;
  undefined1 auVar102 [16];
  vint4 bi_1;
  float fVar106;
  float fVar107;
  float fVar108;
  vint4 ai_1;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  undefined8 local_1118;
  undefined8 uStack_1110;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  RayHit *local_10e0;
  Intersectors *local_10d8;
  RayQueryContext *local_10d0;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined8 local_1058;
  undefined8 uStack_1050;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10d0 = context;
  local_10d8 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_1038 = aVar6.x;
    local_1048 = aVar6.y;
    local_1028 = aVar6.z;
    auVar30 = dpps((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar59 = rsqrtss(auVar30,auVar30);
    fVar28 = auVar59._0_4_;
    local_fb8[0] = fVar28 * 1.5 - fVar28 * fVar28 * auVar30._0_4_ * 0.5 * fVar28;
    auVar89._0_4_ = local_1038 * local_fb8[0];
    auVar89._4_4_ = local_1048 * local_fb8[0];
    auVar89._8_4_ = local_1028 * local_fb8[0];
    auVar89._12_4_ = aVar6.field_3.w * local_fb8[0];
    uVar24 = CONCAT44(auVar89._4_4_,auVar89._4_4_);
    auVar31._0_8_ = uVar24 ^ 0x8000000080000000;
    auVar31._8_4_ = -auVar89._12_4_;
    auVar31._12_4_ = -auVar89._12_4_;
    auVar79._0_12_ = ZEXT812(0);
    auVar79._12_4_ = 0;
    auVar31 = blendps(auVar31,auVar79,0xe);
    auVar30._4_4_ = auVar31._0_4_;
    auVar30._0_4_ = auVar89._8_4_;
    auVar30._8_4_ = auVar31._4_4_;
    auVar30._12_4_ = 0;
    auVar59._4_4_ = auVar31._0_4_;
    auVar59._0_4_ = auVar89._8_4_;
    auVar59._8_4_ = auVar31._4_4_;
    auVar59._12_4_ = 0;
    auVar101 = dpps(auVar59 << 0x20,auVar30 << 0x20,0x7f);
    uVar24 = CONCAT44(auVar89._12_4_,auVar89._8_4_);
    auVar86._0_8_ = uVar24 ^ 0x8000000080000000;
    auVar86._8_4_ = -auVar89._8_4_;
    auVar86._12_4_ = -auVar89._12_4_;
    auVar31 = insertps(auVar86,auVar89,0x2a);
    auVar59 = dpps(auVar31,auVar31,0x7f);
    iVar27 = -(uint)(auVar59._0_4_ < auVar101._0_4_);
    auVar101._4_4_ = iVar27;
    auVar101._0_4_ = iVar27;
    auVar101._8_4_ = iVar27;
    auVar101._12_4_ = iVar27;
    auVar30 = blendvps(auVar31,auVar30 << 0x20,auVar101);
    auVar59 = dpps(auVar30,auVar30,0x7f);
    auVar31 = rsqrtss(auVar59,auVar59);
    fVar28 = auVar31._0_4_;
    fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * auVar59._0_4_ * 0.5 * fVar28;
    fVar29 = fVar28 * auVar30._0_4_;
    fVar48 = fVar28 * auVar30._4_4_;
    fVar50 = fVar28 * auVar30._8_4_;
    fVar28 = fVar28 * auVar30._12_4_;
    fVar85 = fVar48 * auVar89._0_4_ - auVar89._4_4_ * fVar29;
    fVar90 = fVar50 * auVar89._4_4_ - auVar89._8_4_ * fVar48;
    fVar91 = fVar29 * auVar89._8_4_ - auVar89._0_4_ * fVar50;
    auVar87._12_4_ = fVar28 * auVar89._12_4_ - auVar89._12_4_ * fVar28;
    auVar87._0_8_ = CONCAT44(fVar91,fVar90);
    auVar87._8_4_ = fVar85;
    auVar97._8_4_ = fVar85;
    auVar97._0_8_ = auVar87._0_8_;
    auVar97._12_4_ = auVar87._12_4_;
    auVar30 = dpps(auVar97,auVar87,0x7f);
    auVar59 = rsqrtss(auVar30,auVar30);
    fVar28 = auVar59._0_4_;
    fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * auVar30._0_4_ * 0.5 * fVar28;
    local_f88._4_4_ = fVar28 * fVar85;
    local_f88._0_4_ = fVar50;
    local_f88._8_4_ = auVar89._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar28 * fVar91;
    local_f98._0_4_ = fVar48;
    local_f98._8_4_ = auVar89._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar28 * fVar90;
    local_fa8._0_4_ = fVar29;
    local_fa8._8_4_ = auVar89._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    uStack_f70 = 0;
    local_10a8 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar28 = (ray->super_RayK<1>).org.field_0.m128[1];
    local_1068 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar29 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    local_1078 = 0.0;
    if (0.0 <= fVar29) {
      local_1078 = fVar29;
    }
    auVar32._4_4_ = -(uint)(ABS(local_1048) < 1e-18);
    auVar32._0_4_ = -(uint)(ABS(local_1038) < 1e-18);
    auVar32._8_4_ = -(uint)(ABS(local_1028) < 1e-18);
    auVar32._12_4_ = -(uint)(ABS(aVar6.field_3.w) < 1e-18);
    auVar30 = divps(_DAT_01f46a60,(undefined1  [16])aVar6);
    auVar30 = blendvps(auVar30,_DAT_01f76a70,auVar32);
    fVar29 = (ray->super_RayK<1>).tfar;
    fVar48 = 0.0;
    if (0.0 <= fVar29) {
      fVar48 = fVar29;
    }
    local_10b8 = auVar30._0_4_ * 0.99999964;
    local_10c8 = auVar30._4_4_ * 0.99999964;
    local_1098 = auVar30._8_4_ * 0.99999964;
    local_10f8 = auVar30._0_4_ * 1.0000004;
    local_1108 = auVar30._4_4_ * 1.0000004;
    local_1088 = auVar30._8_4_ * 1.0000004;
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    fStack_1024 = local_1028;
    fStack_1020 = local_1028;
    fStack_101c = local_1028;
    uVar26 = (ulong)(local_10b8 < 0.0) * 0x10;
    uVar25 = (ulong)(local_10c8 < 0.0) << 4 | 0x20;
    uVar24 = (ulong)(local_1098 < 0.0) << 4 | 0x40;
    fStack_1064 = local_1068;
    fStack_1060 = local_1068;
    fStack_105c = local_1068;
    fStack_1074 = local_1078;
    fStack_1070 = local_1078;
    fStack_106c = local_1078;
    fStack_1084 = local_1088;
    fStack_1080 = local_1088;
    fStack_107c = local_1088;
    fStack_1094 = local_1098;
    fStack_1090 = local_1098;
    fStack_108c = local_1098;
    fStack_10a4 = local_10a8;
    fStack_10a0 = local_10a8;
    fStack_109c = local_10a8;
    fStack_10b4 = local_10b8;
    fStack_10b0 = local_10b8;
    fStack_10ac = local_10b8;
    fStack_10c4 = local_10c8;
    fStack_10c0 = local_10c8;
    fStack_10bc = local_10c8;
    fStack_10f4 = local_10f8;
    fStack_10f0 = local_10f8;
    fStack_10ec = local_10f8;
    fStack_1104 = local_1108;
    fStack_1100 = local_1108;
    fStack_10fc = local_1108;
    local_10e0 = ray;
    local_1118 = (undefined1 (*) [16])local_f68;
    fVar29 = fVar48;
    fVar50 = fVar48;
    fVar85 = fVar48;
    fVar90 = local_10b8;
    fVar91 = local_10b8;
    fVar110 = local_10b8;
    fVar111 = local_10b8;
    fVar82 = local_1078;
    fVar49 = local_1078;
    fVar92 = local_1078;
    fVar83 = local_1078;
    fVar51 = local_1098;
    fVar93 = local_1098;
    fVar84 = local_1098;
    fVar52 = local_1098;
    fVar57 = local_10a8;
    fVar58 = local_10a8;
    fVar67 = local_10a8;
    fVar68 = local_10a8;
    fVar69 = local_10c8;
    fVar70 = local_10c8;
    fVar71 = local_10c8;
    fVar72 = local_10c8;
    fVar94 = local_1068;
    fVar95 = local_1068;
    fVar96 = local_1068;
    fVar98 = local_1068;
    fVar99 = local_10f8;
    fVar106 = local_10f8;
    fVar107 = local_10f8;
    fVar108 = local_10f8;
    fVar109 = local_1108;
    fVar112 = local_1108;
    fVar113 = local_1108;
    fVar114 = local_1108;
    fVar115 = local_1088;
    fVar103 = local_1088;
    fVar104 = local_1088;
    fVar105 = local_1088;
LAB_0067d79e:
    if (local_1118 != (undefined1 (*) [16])&local_f78) {
      pauVar23 = local_1118 + -1;
      local_1118 = local_1118 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar23 + 8) < *pfVar1 || *(float *)((long)*pauVar23 + 8) == *pfVar1) {
        uVar21 = *(ulong *)*local_1118;
        pauVar23 = local_1118;
        while ((uVar21 & 8) == 0) {
          fVar5 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar20 = (uint)uVar21 & 7;
          uVar22 = uVar21 & 0xfffffffffffffff0;
          if (uVar20 == 3) {
            local_fd8 = *(float *)(uVar22 + 0x20);
            fStack_fd4 = *(float *)(uVar22 + 0x24);
            fStack_fd0 = *(float *)(uVar22 + 0x28);
            fStack_fcc = *(float *)(uVar22 + 0x2c);
            local_1118 = *(undefined1 (**) [16])(uVar22 + 0x30);
            uStack_1110 = *(undefined8 *)(uVar22 + 0x38);
            uVar10 = uStack_1110;
            local_ff8 = *(float *)(uVar22 + 0x50);
            fStack_ff4 = *(float *)(uVar22 + 0x54);
            fStack_ff0 = *(float *)(uVar22 + 0x58);
            fStack_fec = *(float *)(uVar22 + 0x5c);
            local_fe8 = *(float *)(uVar22 + 0x60);
            fStack_fe4 = *(float *)(uVar22 + 100);
            fStack_fe0 = *(float *)(uVar22 + 0x68);
            fStack_fdc = *(float *)(uVar22 + 0x6c);
            local_1018 = *(float *)(uVar22 + 0x80);
            fStack_1014 = *(float *)(uVar22 + 0x84);
            fStack_1010 = *(float *)(uVar22 + 0x88);
            fStack_100c = *(float *)(uVar22 + 0x8c);
            local_1008 = *(float *)(uVar22 + 0x90);
            fStack_1004 = *(float *)(uVar22 + 0x94);
            fStack_1000 = *(float *)(uVar22 + 0x98);
            fStack_ffc = *(float *)(uVar22 + 0x9c);
            local_1058 = *(undefined8 *)(uVar22 + 0xa0);
            uStack_1050 = *(undefined8 *)(uVar22 + 0xa8);
            uVar18 = local_1058;
            uVar19 = uStack_1050;
            fVar94 = 1.0 - fVar5;
            fVar95 = fVar94 * 0.0;
            local_fc8 = *(float *)(uVar22 + 0xf0) * fVar5 + fVar95;
            fStack_fc4 = *(float *)(uVar22 + 0xf4) * fVar5 + fVar95;
            fStack_fc0 = *(float *)(uVar22 + 0xf8) * fVar5 + fVar95;
            fStack_fbc = *(float *)(uVar22 + 0xfc) * fVar5 + fVar95;
            auVar100._0_4_ =
                 local_1038 * local_fd8 + local_1048 * local_ff8 + local_1028 * local_1018;
            auVar100._4_4_ =
                 fStack_1034 * fStack_fd4 + fStack_1044 * fStack_ff4 + fStack_1024 * fStack_1014;
            auVar100._8_4_ =
                 fStack_1030 * fStack_fd0 + fStack_1040 * fStack_ff0 + fStack_1020 * fStack_1010;
            auVar100._12_4_ =
                 fStack_102c * fStack_fcc + fStack_103c * fStack_fec + fStack_101c * fStack_100c;
            fVar90 = (float)DAT_01f4bd50;
            fVar91 = DAT_01f4bd50._4_4_;
            fVar110 = DAT_01f4bd50._8_4_;
            fVar111 = DAT_01f4bd50._12_4_;
            auVar35._4_4_ = -(uint)(ABS(auVar100._4_4_) < fVar91);
            auVar35._0_4_ = -(uint)(ABS(auVar100._0_4_) < fVar90);
            auVar35._8_4_ = -(uint)(ABS(auVar100._8_4_) < fVar110);
            auVar35._12_4_ = -(uint)(ABS(auVar100._12_4_) < fVar111);
            auVar101 = blendvps(auVar100,_DAT_01f4bd50,auVar35);
            local_1118._4_4_ = (float)((ulong)local_1118 >> 0x20);
            uStack_1110._4_4_ = (float)((ulong)uStack_1110 >> 0x20);
            auVar75._0_4_ =
                 local_1038 * (float)local_1118 + local_1048 * local_fe8 + local_1028 * local_1008;
            auVar75._4_4_ =
                 fStack_1034 * local_1118._4_4_ +
                 fStack_1044 * fStack_fe4 + fStack_1024 * fStack_1004;
            auVar75._8_4_ =
                 fStack_1030 * (float)uStack_1110 +
                 fStack_1040 * fStack_fe0 + fStack_1020 * fStack_1000;
            auVar75._12_4_ =
                 fStack_102c * uStack_1110._4_4_ +
                 fStack_103c * fStack_fdc + fStack_101c * fStack_ffc;
            auVar36._4_4_ = -(uint)(ABS(auVar75._4_4_) < fVar91);
            auVar36._0_4_ = -(uint)(ABS(auVar75._0_4_) < fVar90);
            auVar36._8_4_ = -(uint)(ABS(auVar75._8_4_) < fVar110);
            auVar36._12_4_ = -(uint)(ABS(auVar75._12_4_) < fVar111);
            auVar31 = blendvps(auVar75,_DAT_01f4bd50,auVar36);
            local_1058._4_4_ = (float)((ulong)local_1058 >> 0x20);
            uStack_1050._4_4_ = (float)((ulong)uStack_1050 >> 0x20);
            auVar63._0_4_ =
                 local_1038 * *(float *)(uVar22 + 0x40) +
                 local_1048 * *(float *)(uVar22 + 0x70) + local_1028 * (float)local_1058;
            auVar63._4_4_ =
                 fStack_1034 * *(float *)(uVar22 + 0x44) +
                 fStack_1044 * *(float *)(uVar22 + 0x74) + fStack_1024 * local_1058._4_4_;
            auVar63._8_4_ =
                 fStack_1030 * *(float *)(uVar22 + 0x48) +
                 fStack_1040 * *(float *)(uVar22 + 0x78) + fStack_1020 * (float)uStack_1050;
            auVar63._12_4_ =
                 fStack_102c * *(float *)(uVar22 + 0x4c) +
                 fStack_103c * *(float *)(uVar22 + 0x7c) + fStack_101c * uStack_1050._4_4_;
            auVar37._4_4_ = -(uint)(ABS(auVar63._4_4_) < fVar91);
            auVar37._0_4_ = -(uint)(ABS(auVar63._0_4_) < fVar90);
            auVar37._8_4_ = -(uint)(ABS(auVar63._8_4_) < fVar110);
            auVar37._12_4_ = -(uint)(ABS(auVar63._12_4_) < fVar111);
            auVar59 = blendvps(auVar63,_DAT_01f4bd50,auVar37);
            auVar30 = rcpps(auVar37,auVar101);
            fVar90 = auVar30._0_4_;
            fVar111 = auVar30._4_4_;
            fVar92 = auVar30._8_4_;
            fVar93 = auVar30._12_4_;
            fVar90 = (1.0 - auVar101._0_4_ * fVar90) * fVar90 + fVar90;
            fVar111 = (1.0 - auVar101._4_4_ * fVar111) * fVar111 + fVar111;
            fVar92 = (1.0 - auVar101._8_4_ * fVar92) * fVar92 + fVar92;
            fVar93 = (1.0 - auVar101._12_4_ * fVar93) * fVar93 + fVar93;
            auVar30 = rcpps(auVar30,auVar31);
            fVar91 = auVar30._0_4_;
            auVar76._0_4_ = auVar31._0_4_ * fVar91;
            fVar82 = auVar30._4_4_;
            auVar76._4_4_ = auVar31._4_4_ * fVar82;
            fVar83 = auVar30._8_4_;
            auVar76._8_4_ = auVar31._8_4_ * fVar83;
            fVar84 = auVar30._12_4_;
            auVar76._12_4_ = auVar31._12_4_ * fVar84;
            fVar91 = (1.0 - auVar76._0_4_) * fVar91 + fVar91;
            fVar82 = (1.0 - auVar76._4_4_) * fVar82 + fVar82;
            fVar83 = (1.0 - auVar76._8_4_) * fVar83 + fVar83;
            fVar84 = (1.0 - auVar76._12_4_) * fVar84 + fVar84;
            auVar30 = rcpps(auVar76,auVar59);
            fVar110 = auVar30._0_4_;
            fVar49 = auVar30._4_4_;
            fVar51 = auVar30._8_4_;
            fVar52 = auVar30._12_4_;
            fVar110 = (1.0 - auVar59._0_4_ * fVar110) * fVar110 + fVar110;
            fVar49 = (1.0 - auVar59._4_4_ * fVar49) * fVar49 + fVar49;
            fVar51 = (1.0 - auVar59._8_4_ * fVar51) * fVar51 + fVar51;
            fVar52 = (1.0 - auVar59._12_4_ * fVar52) * fVar52 + fVar52;
            fVar57 = local_fd8 * local_10a8 +
                     local_ff8 * fVar28 + local_1018 * local_1068 + *(float *)(uVar22 + 0xb0);
            fVar67 = fStack_fd4 * fStack_10a4 +
                     fStack_ff4 * fVar28 + fStack_1014 * fStack_1064 + *(float *)(uVar22 + 0xb4);
            fVar69 = fStack_fd0 * fStack_10a0 +
                     fStack_ff0 * fVar28 + fStack_1010 * fStack_1060 + *(float *)(uVar22 + 0xb8);
            fVar71 = fStack_fcc * fStack_109c +
                     fStack_fec * fVar28 + fStack_100c * fStack_105c + *(float *)(uVar22 + 0xbc);
            fVar58 = (float)local_1118 * local_10a8 +
                     local_fe8 * fVar28 + local_1008 * local_1068 + *(float *)(uVar22 + 0xc0);
            fVar68 = local_1118._4_4_ * fStack_10a4 +
                     fStack_fe4 * fVar28 + fStack_1004 * fStack_1064 + *(float *)(uVar22 + 0xc4);
            fVar70 = (float)uStack_1110 * fStack_10a0 +
                     fStack_fe0 * fVar28 + fStack_1000 * fStack_1060 + *(float *)(uVar22 + 200);
            fVar72 = uStack_1110._4_4_ * fStack_109c +
                     fStack_fdc * fVar28 + fStack_ffc * fStack_105c + *(float *)(uVar22 + 0xcc);
            fVar112 = *(float *)(uVar22 + 0x40) * local_10a8 +
                      *(float *)(uVar22 + 0x70) * fVar28 +
                      (float)local_1058 * local_1068 + *(float *)(uVar22 + 0xd0);
            fVar113 = *(float *)(uVar22 + 0x44) * fStack_10a4 +
                      *(float *)(uVar22 + 0x74) * fVar28 +
                      local_1058._4_4_ * fStack_1064 + *(float *)(uVar22 + 0xd4);
            fVar114 = *(float *)(uVar22 + 0x48) * fStack_10a0 +
                      *(float *)(uVar22 + 0x78) * fVar28 +
                      (float)uStack_1050 * fStack_1060 + *(float *)(uVar22 + 0xd8);
            fVar115 = *(float *)(uVar22 + 0x4c) * fStack_109c +
                      *(float *)(uVar22 + 0x7c) * fVar28 +
                      uStack_1050._4_4_ * fStack_105c + *(float *)(uVar22 + 0xdc);
            fVar106 = ((*(float *)(uVar22 + 0xe0) * fVar5 + fVar95) - fVar57) * fVar90;
            fVar107 = ((*(float *)(uVar22 + 0xe4) * fVar5 + fVar95) - fVar67) * fVar111;
            fVar108 = ((*(float *)(uVar22 + 0xe8) * fVar5 + fVar95) - fVar69) * fVar92;
            fVar109 = ((*(float *)(uVar22 + 0xec) * fVar5 + fVar95) - fVar71) * fVar93;
            fVar90 = ((*(float *)(uVar22 + 0x110) * fVar5 + fVar94) - fVar57) * fVar90;
            fVar111 = ((*(float *)(uVar22 + 0x114) * fVar5 + fVar94) - fVar67) * fVar111;
            fVar92 = ((*(float *)(uVar22 + 0x118) * fVar5 + fVar94) - fVar69) * fVar92;
            fVar93 = ((*(float *)(uVar22 + 0x11c) * fVar5 + fVar94) - fVar71) * fVar93;
            fVar57 = (local_fc8 - fVar58) * fVar91;
            fVar67 = (fStack_fc4 - fVar68) * fVar82;
            fVar69 = (fStack_fc0 - fVar70) * fVar83;
            fVar71 = (fStack_fbc - fVar72) * fVar84;
            fVar96 = ((fVar95 + *(float *)(uVar22 + 0x100) * fVar5) - fVar112) * fVar110;
            fVar98 = ((fVar95 + *(float *)(uVar22 + 0x104) * fVar5) - fVar113) * fVar49;
            fVar99 = ((fVar95 + *(float *)(uVar22 + 0x108) * fVar5) - fVar114) * fVar51;
            fVar95 = ((fVar95 + *(float *)(uVar22 + 0x10c) * fVar5) - fVar115) * fVar52;
            fVar91 = ((*(float *)(uVar22 + 0x120) * fVar5 + fVar94) - fVar58) * fVar91;
            fVar82 = ((*(float *)(uVar22 + 0x124) * fVar5 + fVar94) - fVar68) * fVar82;
            fVar83 = ((*(float *)(uVar22 + 0x128) * fVar5 + fVar94) - fVar70) * fVar83;
            fVar84 = ((*(float *)(uVar22 + 300) * fVar5 + fVar94) - fVar72) * fVar84;
            fVar110 = ((fVar5 * *(float *)(uVar22 + 0x130) + fVar94) - fVar112) * fVar110;
            fVar49 = ((fVar5 * *(float *)(uVar22 + 0x134) + fVar94) - fVar113) * fVar49;
            fVar51 = ((fVar5 * *(float *)(uVar22 + 0x138) + fVar94) - fVar114) * fVar51;
            fVar52 = ((fVar5 * *(float *)(uVar22 + 0x13c) + fVar94) - fVar115) * fVar52;
            auVar38._0_4_ =
                 (uint)((int)fVar91 < (int)fVar57) * (int)fVar91 |
                 (uint)((int)fVar91 >= (int)fVar57) * (int)fVar57;
            auVar38._4_4_ =
                 (uint)((int)fVar82 < (int)fVar67) * (int)fVar82 |
                 (uint)((int)fVar82 >= (int)fVar67) * (int)fVar67;
            auVar38._8_4_ =
                 (uint)((int)fVar83 < (int)fVar69) * (int)fVar83 |
                 (uint)((int)fVar83 >= (int)fVar69) * (int)fVar69;
            auVar38._12_4_ =
                 (uint)((int)fVar84 < (int)fVar71) * (int)fVar84 |
                 (uint)((int)fVar84 >= (int)fVar71) * (int)fVar71;
            auVar64._0_4_ =
                 (uint)((int)fVar110 < (int)fVar96) * (int)fVar110 |
                 (uint)((int)fVar110 >= (int)fVar96) * (int)fVar96;
            auVar64._4_4_ =
                 (uint)((int)fVar49 < (int)fVar98) * (int)fVar49 |
                 (uint)((int)fVar49 >= (int)fVar98) * (int)fVar98;
            auVar64._8_4_ =
                 (uint)((int)fVar51 < (int)fVar99) * (int)fVar51 |
                 (uint)((int)fVar51 >= (int)fVar99) * (int)fVar99;
            auVar64._12_4_ =
                 (uint)((int)fVar52 < (int)fVar95) * (int)fVar52 |
                 (uint)((int)fVar52 >= (int)fVar95) * (int)fVar95;
            auVar30 = maxps(auVar38,auVar64);
            auVar65._0_4_ =
                 (uint)((int)fVar90 < (int)fVar106) * (int)fVar90 |
                 (uint)((int)fVar90 >= (int)fVar106) * (int)fVar106;
            auVar65._4_4_ =
                 (uint)((int)fVar111 < (int)fVar107) * (int)fVar111 |
                 (uint)((int)fVar111 >= (int)fVar107) * (int)fVar107;
            auVar65._8_4_ =
                 (uint)((int)fVar92 < (int)fVar108) * (int)fVar92 |
                 (uint)((int)fVar92 >= (int)fVar108) * (int)fVar108;
            auVar65._12_4_ =
                 (uint)((int)fVar93 < (int)fVar109) * (int)fVar93 |
                 (uint)((int)fVar93 >= (int)fVar109) * (int)fVar109;
            auVar102._0_4_ =
                 (uint)((int)fVar91 < (int)fVar57) * (int)fVar57 |
                 (uint)((int)fVar91 >= (int)fVar57) * (int)fVar91;
            auVar102._4_4_ =
                 (uint)((int)fVar82 < (int)fVar67) * (int)fVar67 |
                 (uint)((int)fVar82 >= (int)fVar67) * (int)fVar82;
            auVar102._8_4_ =
                 (uint)((int)fVar83 < (int)fVar69) * (int)fVar69 |
                 (uint)((int)fVar83 >= (int)fVar69) * (int)fVar83;
            auVar102._12_4_ =
                 (uint)((int)fVar84 < (int)fVar71) * (int)fVar71 |
                 (uint)((int)fVar84 >= (int)fVar71) * (int)fVar84;
            auVar17._4_4_ = fStack_1074;
            auVar17._0_4_ = local_1078;
            auVar17._8_4_ = fStack_1070;
            auVar17._12_4_ = fStack_106c;
            auVar54._0_4_ =
                 (uint)((int)fVar110 < (int)fVar96) * (int)fVar96 |
                 (uint)((int)fVar110 >= (int)fVar96) * (int)fVar110;
            auVar54._4_4_ =
                 (uint)((int)fVar49 < (int)fVar98) * (int)fVar98 |
                 (uint)((int)fVar49 >= (int)fVar98) * (int)fVar49;
            auVar54._8_4_ =
                 (uint)((int)fVar51 < (int)fVar99) * (int)fVar99 |
                 (uint)((int)fVar51 >= (int)fVar99) * (int)fVar51;
            auVar54._12_4_ =
                 (uint)((int)fVar52 < (int)fVar95) * (int)fVar95 |
                 (uint)((int)fVar52 >= (int)fVar95) * (int)fVar52;
            auVar31 = minps(auVar102,auVar54);
            auVar59 = maxps(auVar17,auVar65);
            auVar59 = maxps(auVar59,auVar30);
            auVar39._4_4_ = fVar29;
            auVar39._0_4_ = fVar48;
            auVar39._8_4_ = fVar50;
            auVar39._12_4_ = fVar85;
            auVar16._4_4_ =
                 (uint)((int)fVar111 < (int)fVar107) * (int)fVar107 |
                 (uint)((int)fVar111 >= (int)fVar107) * (int)fVar111;
            auVar16._0_4_ =
                 (uint)((int)fVar90 < (int)fVar106) * (int)fVar106 |
                 (uint)((int)fVar90 >= (int)fVar106) * (int)fVar90;
            auVar16._8_4_ =
                 (uint)((int)fVar92 < (int)fVar108) * (int)fVar108 |
                 (uint)((int)fVar92 >= (int)fVar108) * (int)fVar92;
            auVar16._12_4_ =
                 (uint)((int)fVar93 < (int)fVar109) * (int)fVar109 |
                 (uint)((int)fVar93 >= (int)fVar109) * (int)fVar93;
            auVar30 = minps(auVar39,auVar16);
            auVar30 = minps(auVar30,auVar31);
            local_1128._0_4_ = auVar59._0_4_ * 0.99999964;
            local_1128._4_4_ = auVar59._4_4_ * 0.99999964;
            fStack_1120 = auVar59._8_4_ * 0.99999964;
            fStack_111c = auVar59._12_4_ * 0.99999964;
            auVar55._4_4_ = -(uint)((float)local_1128._4_4_ <= auVar30._4_4_ * 1.0000004);
            auVar55._0_4_ = -(uint)((float)local_1128._0_4_ <= auVar30._0_4_ * 1.0000004);
            auVar55._8_4_ = -(uint)(fStack_1120 <= auVar30._8_4_ * 1.0000004);
            auVar55._12_4_ = -(uint)(fStack_111c <= auVar30._12_4_ * 1.0000004);
            uVar20 = movmskps((int)context,auVar55);
            fVar90 = local_10b8;
            fVar91 = fStack_10b4;
            fVar110 = fStack_10b0;
            fVar111 = fStack_10ac;
            fVar82 = local_1078;
            fVar49 = fStack_1074;
            fVar92 = fStack_1070;
            fVar83 = fStack_106c;
            fVar51 = local_1098;
            fVar93 = fStack_1094;
            fVar84 = fStack_1090;
            fVar52 = fStack_108c;
            fVar57 = local_10a8;
            fVar58 = fStack_10a4;
            fVar67 = fStack_10a0;
            fVar68 = fStack_109c;
            fVar69 = local_10c8;
            fVar70 = fStack_10c4;
            fVar71 = fStack_10c0;
            fVar72 = fStack_10bc;
            fVar94 = local_1068;
            fVar95 = fStack_1064;
            fVar96 = fStack_1060;
            fVar98 = fStack_105c;
            fVar99 = local_10f8;
            fVar106 = fStack_10f4;
            fVar107 = fStack_10f0;
            fVar108 = fStack_10ec;
            fVar109 = local_1108;
            fVar112 = fStack_1104;
            fVar113 = fStack_1100;
            fVar114 = fStack_10fc;
            fVar115 = local_1088;
            fVar103 = fStack_1084;
            fVar104 = fStack_1080;
            fVar105 = fStack_107c;
            uStack_1110 = uVar10;
            local_1058 = uVar18;
            uStack_1050 = uVar19;
          }
          else {
            pfVar3 = (float *)(uVar22 + 0x80 + uVar26);
            pfVar1 = (float *)(uVar22 + 0x20 + uVar26);
            pfVar4 = (float *)(uVar22 + 0x80 + uVar25);
            pfVar2 = (float *)(uVar22 + 0x20 + uVar25);
            auVar60._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar57) * fVar90;
            auVar60._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar58) * fVar91;
            auVar60._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar67) * fVar110;
            auVar60._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar68) * fVar111;
            auVar73._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar28) * fVar69;
            auVar73._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar28) * fVar70;
            auVar73._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar28) * fVar71;
            auVar73._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar28) * fVar72;
            pfVar2 = (float *)(uVar22 + 0x80 + uVar24);
            pfVar1 = (float *)(uVar22 + 0x20 + uVar24);
            auVar33._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar94) * fVar51;
            auVar33._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar95) * fVar93;
            auVar33._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar96) * fVar84;
            auVar33._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar98) * fVar52;
            auVar59 = maxps(auVar73,auVar33);
            auVar34._4_4_ = fVar49;
            auVar34._0_4_ = fVar82;
            auVar34._8_4_ = fVar92;
            auVar34._12_4_ = fVar83;
            auVar30 = maxps(auVar34,auVar60);
            pfVar2 = (float *)(uVar22 + 0x80 + (uVar26 ^ 0x10));
            pfVar1 = (float *)(uVar22 + 0x20 + (uVar26 ^ 0x10));
            _local_1128 = maxps(auVar30,auVar59);
            auVar80._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar57) * fVar99;
            auVar80._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar58) * fVar106;
            auVar80._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar67) * fVar107;
            auVar80._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar68) * fVar108;
            pfVar3 = (float *)(uVar22 + 0x80 + (uVar25 ^ 0x10));
            pfVar1 = (float *)(uVar22 + 0x20 + (uVar25 ^ 0x10));
            pfVar4 = (float *)(uVar22 + 0x80 + (uVar24 ^ 0x10));
            pfVar2 = (float *)(uVar22 + 0x20 + (uVar24 ^ 0x10));
            auVar74._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar28) * fVar109;
            auVar74._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar28) * fVar112;
            auVar74._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar28) * fVar113;
            auVar74._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar28) * fVar114;
            auVar61._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar94) * fVar115;
            auVar61._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar95) * fVar103;
            auVar61._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar96) * fVar104;
            auVar61._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar98) * fVar105;
            auVar59 = minps(auVar74,auVar61);
            auVar62._4_4_ = fVar29;
            auVar62._0_4_ = fVar48;
            auVar62._8_4_ = fVar50;
            auVar62._12_4_ = fVar85;
            auVar30 = minps(auVar62,auVar80);
            auVar30 = minps(auVar30,auVar59);
            if (uVar20 == 6) {
              bVar12 = (fVar5 < *(float *)(uVar22 + 0xf0) && *(float *)(uVar22 + 0xe0) <= fVar5) &&
                       local_1128._0_4_ <= auVar30._0_4_;
              bVar13 = (fVar5 < *(float *)(uVar22 + 0xf4) && *(float *)(uVar22 + 0xe4) <= fVar5) &&
                       local_1128._4_4_ <= auVar30._4_4_;
              bVar14 = (fVar5 < *(float *)(uVar22 + 0xf8) && *(float *)(uVar22 + 0xe8) <= fVar5) &&
                       local_1128._8_4_ <= auVar30._8_4_;
              bVar15 = (fVar5 < *(float *)(uVar22 + 0xfc) && *(float *)(uVar22 + 0xec) <= fVar5) &&
                       local_1128._12_4_ <= auVar30._12_4_;
            }
            else {
              bVar12 = local_1128._0_4_ <= auVar30._0_4_;
              bVar13 = local_1128._4_4_ <= auVar30._4_4_;
              bVar14 = local_1128._8_4_ <= auVar30._8_4_;
              bVar15 = local_1128._12_4_ <= auVar30._12_4_;
            }
            auVar53._0_4_ = (uint)bVar12 * -0x80000000;
            auVar53._4_4_ = (uint)bVar13 * -0x80000000;
            auVar53._8_4_ = (uint)bVar14 * -0x80000000;
            auVar53._12_4_ = (uint)bVar15 * -0x80000000;
            uVar20 = movmskps((int)context,auVar53);
          }
          context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar20);
          local_1118 = pauVar23;
          if (context == (RayQueryContext *)0x0) goto LAB_0067d79e;
          lVar11 = 0;
          if (context != (RayQueryContext *)0x0) {
            for (; ((ulong)context >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          uVar21 = *(ulong *)(uVar22 + lVar11 * 8);
          uVar20 = uVar20 - 1 & uVar20;
          if (uVar20 != 0) {
            uVar7 = *(uint *)(local_1128 + lVar11 * 4);
            lVar11 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            uVar9 = *(ulong *)(uVar22 + lVar11 * 8);
            uVar8 = *(uint *)(local_1128 + lVar11 * 4);
            uVar20 = uVar20 - 1 & uVar20;
            context = (RayQueryContext *)(ulong)uVar20;
            if (uVar20 == 0) {
              if (uVar7 < uVar8) {
                *(ulong *)*pauVar23 = uVar9;
                *(uint *)((long)*pauVar23 + 8) = uVar8;
                pauVar23 = pauVar23 + 1;
              }
              else {
                *(ulong *)*pauVar23 = uVar21;
                *(uint *)((long)*pauVar23 + 8) = uVar7;
                uVar21 = uVar9;
                pauVar23 = pauVar23 + 1;
              }
            }
            else {
              auVar56._8_4_ = uVar7;
              auVar56._0_8_ = uVar21;
              auVar56._12_4_ = 0;
              auVar77._8_4_ = uVar8;
              auVar77._0_8_ = uVar9;
              auVar77._12_4_ = 0;
              lVar11 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar20 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              uVar10 = *(undefined8 *)(uVar22 + lVar11 * 8);
              iVar27 = *(int *)(local_1128 + lVar11 * 4);
              auVar66._8_4_ = iVar27;
              auVar66._0_8_ = uVar10;
              auVar66._12_4_ = 0;
              auVar40._8_4_ = -(uint)((int)uVar7 < (int)uVar8);
              uVar20 = uVar20 - 1 & uVar20;
              if (uVar20 == 0) {
                auVar40._4_4_ = auVar40._8_4_;
                auVar40._0_4_ = auVar40._8_4_;
                auVar40._12_4_ = auVar40._8_4_;
                auVar81._8_4_ = uVar8;
                auVar81._0_8_ = uVar9;
                auVar81._12_4_ = 0;
                auVar59 = blendvps(auVar81,auVar56,auVar40);
                auVar30 = blendvps(auVar56,auVar77,auVar40);
                auVar41._8_4_ = -(uint)(auVar59._8_4_ < iVar27);
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                auVar78._8_4_ = iVar27;
                auVar78._0_8_ = uVar10;
                auVar78._12_4_ = 0;
                auVar31 = blendvps(auVar78,auVar59,auVar41);
                auVar101 = blendvps(auVar59,auVar66,auVar41);
                auVar42._8_4_ = -(uint)(auVar30._8_4_ < auVar101._8_4_);
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                auVar59 = blendvps(auVar101,auVar30,auVar42);
                auVar30 = blendvps(auVar30,auVar101,auVar42);
                *pauVar23 = auVar30;
                pauVar23[1] = auVar59;
                uVar21 = auVar31._0_8_;
                pauVar23 = pauVar23 + 2;
              }
              else {
                lVar11 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                auVar43._4_4_ = auVar40._8_4_;
                auVar43._0_4_ = auVar40._8_4_;
                auVar43._8_4_ = auVar40._8_4_;
                auVar43._12_4_ = auVar40._8_4_;
                auVar101 = blendvps(auVar77,auVar56,auVar43);
                auVar30 = blendvps(auVar56,auVar77,auVar43);
                auVar88._8_4_ = *(int *)(local_1128 + lVar11 * 4);
                auVar88._0_8_ = *(undefined8 *)(uVar22 + lVar11 * 8);
                auVar88._12_4_ = 0;
                auVar44._8_4_ = -(uint)(iVar27 < *(int *)(local_1128 + lVar11 * 4));
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar31 = blendvps(auVar88,auVar66,auVar44);
                auVar59 = blendvps(auVar66,auVar88,auVar44);
                auVar45._8_4_ = -(uint)(auVar30._8_4_ < auVar59._8_4_);
                auVar45._4_4_ = auVar45._8_4_;
                auVar45._0_4_ = auVar45._8_4_;
                auVar45._12_4_ = auVar45._8_4_;
                auVar89 = blendvps(auVar59,auVar30,auVar45);
                auVar30 = blendvps(auVar30,auVar59,auVar45);
                auVar46._8_4_ = -(uint)(auVar101._8_4_ < auVar31._8_4_);
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                auVar59 = blendvps(auVar31,auVar101,auVar46);
                auVar101 = blendvps(auVar101,auVar31,auVar46);
                auVar47._8_4_ = -(uint)(auVar101._8_4_ < auVar89._8_4_);
                auVar47._4_4_ = auVar47._8_4_;
                auVar47._0_4_ = auVar47._8_4_;
                auVar47._12_4_ = auVar47._8_4_;
                auVar31 = blendvps(auVar89,auVar101,auVar47);
                auVar101 = blendvps(auVar101,auVar89,auVar47);
                *pauVar23 = auVar30;
                pauVar23[1] = auVar101;
                pauVar23[2] = auVar31;
                uVar21 = auVar59._0_8_;
                pauVar23 = pauVar23 + 3;
                fVar99 = local_10f8;
                fVar106 = fStack_10f4;
                fVar107 = fStack_10f0;
                fVar108 = fStack_10ec;
                fVar109 = local_1108;
                fVar112 = fStack_1104;
                fVar113 = fStack_1100;
                fVar114 = fStack_10fc;
              }
            }
          }
        }
        local_1118 = pauVar23;
        (**(code **)((long)local_10d8->leafIntersector +
                    (ulong)*(byte *)(uVar21 & 0xfffffffffffffff0) * 0x40))(local_fb8,ray,local_10d0)
        ;
        fVar48 = (local_10e0->super_RayK<1>).tfar;
        context = extraout_RDX;
        ray = local_10e0;
        fVar29 = fVar48;
        fVar50 = fVar48;
        fVar85 = fVar48;
        fVar90 = local_10b8;
        fVar91 = fStack_10b4;
        fVar110 = fStack_10b0;
        fVar111 = fStack_10ac;
        fVar82 = local_1078;
        fVar49 = fStack_1074;
        fVar92 = fStack_1070;
        fVar83 = fStack_106c;
        fVar51 = local_1098;
        fVar93 = fStack_1094;
        fVar84 = fStack_1090;
        fVar52 = fStack_108c;
        fVar57 = local_10a8;
        fVar58 = fStack_10a4;
        fVar67 = fStack_10a0;
        fVar68 = fStack_109c;
        fVar69 = local_10c8;
        fVar70 = fStack_10c4;
        fVar71 = fStack_10c0;
        fVar72 = fStack_10bc;
        fVar94 = local_1068;
        fVar95 = fStack_1064;
        fVar96 = fStack_1060;
        fVar98 = fStack_105c;
        fVar99 = local_10f8;
        fVar106 = fStack_10f4;
        fVar107 = fStack_10f0;
        fVar108 = fStack_10ec;
        fVar109 = local_1108;
        fVar112 = fStack_1104;
        fVar113 = fStack_1100;
        fVar114 = fStack_10fc;
        fVar115 = local_1088;
        fVar103 = fStack_1084;
        fVar104 = fStack_1080;
        fVar105 = fStack_107c;
      }
      goto LAB_0067d79e;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }